

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_keypair_xonly_pub
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *pubkey,int *pk_parity,
              secp256k1_keypair *keypair)

{
  int iVar1;
  undefined1 local_88 [4];
  int tmp;
  secp256k1_ge pk;
  secp256k1_keypair *keypair_local;
  int *pk_parity_local;
  secp256k1_xonly_pubkey *pubkey_local;
  secp256k1_context *ctx_local;
  
  pk._80_8_ = keypair;
  if (pubkey == (secp256k1_xonly_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    memset(pubkey,0,0x40);
    if (pk._80_8_ == 0) {
      secp256k1_callback_call(&ctx->illegal_callback,"keypair != NULL");
      ctx_local._4_4_ = 0;
    }
    else {
      iVar1 = secp256k1_keypair_load
                        (ctx,(secp256k1_scalar *)0x0,(secp256k1_ge *)local_88,
                         (secp256k1_keypair *)pk._80_8_);
      if (iVar1 == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        iVar1 = secp256k1_extrakeys_ge_even_y((secp256k1_ge *)local_88);
        if (pk_parity != (int *)0x0) {
          *pk_parity = iVar1;
        }
        secp256k1_xonly_pubkey_save(pubkey,(secp256k1_ge *)local_88);
        ctx_local._4_4_ = 1;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_keypair_xonly_pub(const secp256k1_context* ctx, secp256k1_xonly_pubkey *pubkey, int *pk_parity, const secp256k1_keypair *keypair) {
    secp256k1_ge pk;
    int tmp;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(keypair != NULL);

    if (!secp256k1_keypair_load(ctx, NULL, &pk, keypair)) {
        return 0;
    }
    tmp = secp256k1_extrakeys_ge_even_y(&pk);
    if (pk_parity != NULL) {
        *pk_parity = tmp;
    }
    secp256k1_xonly_pubkey_save(pubkey, &pk);

    return 1;
}